

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidRankInconsistency(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ActivationParams *pAVar3;
  Tensor *pTVar4;
  ostream *poVar5;
  Result local_a8;
  NeuralNetworkLayer *l2;
  NeuralNetworkLayer *l;
  NeuralNetwork *nn;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  out = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)out,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nn = (NeuralNetwork *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nn,"C");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)nn);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  l = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)l,EXACT_ARRAY_MAPPING);
  l2 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l);
  pAVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(l2);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar3);
  CoreML::Specification::NeuralNetworkLayer::set_name(l2,"relu1");
  CoreML::Specification::NeuralNetworkLayer::add_input(l2,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(l2,"B");
  pTVar4 = CoreML::Specification::NeuralNetworkLayer::add_outputtensor(l2);
  CoreML::Specification::Tensor::set_rank(pTVar4,1);
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)l);
  pAVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_activation
                     ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar3);
  CoreML::Specification::NeuralNetworkLayer::set_name
            ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage,"relu2");
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage,"B");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage,"C");
  pTVar4 = CoreML::Specification::NeuralNetworkLayer::add_inputtensor
                     ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage);
  CoreML::Specification::Tensor::set_rank(pTVar4,2);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_a8);
  if (m._oneof_case_[0]._0_1_) {
    poVar5 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0x12ce);
    poVar5 = std::operator<<(poVar5,": error: ");
    poVar5 = std::operator<<(poVar5,"!((res).good())");
    poVar5 = std::operator<<(poVar5," was false, expected true.");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidRankInconsistency() {
    /*
     A -> relu1 -> B -> relu2 -> C
     rank of B when output of relu1 : 1
     rank of B when input of relu2: 2 (makes the model invalid)
     */
    
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("C");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    
    auto *l = nn->add_layers();
    (void)l->mutable_activation()->mutable_relu();
    l->set_name("relu1");
    l->add_input("A");
    l->add_output("B");
    l->add_outputtensor()->set_rank(1);
    
    auto *l2 = nn->add_layers();
    (void)l2->mutable_activation()->mutable_relu();
    l2->set_name("relu2");
    l2->add_input("B");
    l2->add_output("C");
    l2->add_inputtensor()->set_rank(2);
    
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}